

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O0

void filter_intra_predictor_sse4_1
               (void *dest,ptrdiff_t stride,void *top_row,void *left_column,int mode,int width,
               int height)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  void *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *extraout_XMM0_Qa;
  __m128i *extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  ulong extraout_XMM0_Qa_06;
  ptrdiff_t extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  __m128i *taps_6_7_00;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  int in_stack_00000008;
  int x_1;
  int y;
  int x;
  ptrdiff_t stride4;
  ptrdiff_t stride2;
  __m128i left;
  __m128i pixels;
  __m128i pixel_order2;
  int64_t kInsertTopLeftMask;
  __m128i pixel_order1;
  int64_t kCondenseLeftMask;
  __m128i taps_6_7;
  __m128i taps_4_5;
  __m128i taps_2_3;
  __m128i taps_0_1;
  uint8_t *dst;
  uint8_t *left_ptr;
  uint8_t *top_ptr;
  int local_254;
  int local_250;
  int local_24c;
  undefined1 local_238 [16];
  __m128i *taps_4_5_00;
  __m128i *in_stack_fffffffffffffe18;
  __m128i *taps_0_1_00;
  __m128i *pixels_00;
  ptrdiff_t stride_00;
  uint8_t *dst_00;
  long local_198;
  undefined8 in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  uint8_t *in_stack_fffffffffffffeb8;
  ptrdiff_t in_stack_fffffffffffffec0;
  uint8_t *in_stack_fffffffffffffec8;
  __m128i *in_stack_ffffffffffffff90;
  
  if (in_R9D == 4) {
    filter_4xh(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (int)in_stack_fffffffffffffea8);
  }
  else {
    xx_load_128(av1_filter_intra_taps + in_R8D);
    xx_load_128(av1_filter_intra_taps[in_R8D] + 2);
    xx_load_128(av1_filter_intra_taps[in_R8D] + 4);
    dst_00 = extraout_XMM0_Qa;
    xx_load_128(av1_filter_intra_taps[in_R8D] + 6);
    taps_0_1_00 = (__m128i *)0xf09080403020100;
    taps_4_5_00 = (__m128i *)0xf09080403020100;
    pixels_00 = extraout_XMM0_Qa_00;
    stride_00 = extraout_XMM0_Qb;
    xx_loadl_64((void *)(in_RDX + -1));
    xx_loadl_32(in_RCX);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = extraout_XMM0_Qa_02;
    local_238 = auVar10 << 0x40;
    auVar9._8_8_ = extraout_XMM0_Qb_00 | extraout_XMM0_Qa_02;
    auVar9._0_8_ = extraout_XMM0_Qa_01;
    auVar8._8_8_ = taps_4_5_00;
    auVar8._0_8_ = 0xf09080403020100;
    pshufb(auVar9,auVar8);
    filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00,
                      in_stack_ffffffffffffff90);
    xx_loadl_32((void *)(in_RDI + in_RSI));
    local_238._0_8_ = local_238._1_8_;
    local_238._8_8_ = extraout_XMM0_Qa_02 >> 8;
    taps_6_7_00 = (__m128i *)(extraout_XMM0_Qb_01 | local_238._8_8_);
    auVar7._8_8_ = taps_6_7_00;
    auVar7._0_8_ = extraout_XMM0_Qa_03 | local_238._0_8_;
    auVar6._8_8_ = 0xf0a090302010008;
    auVar6._0_8_ = 0xf0a090302010008;
    pshufb(auVar7,auVar6);
    filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00,
                      taps_6_7_00);
    local_198 = in_RDI + 4;
    for (local_24c = 3; local_24c < in_R9D + -4; local_24c = local_24c + 4) {
      xx_loadl_32((void *)(in_RDX + local_24c));
      filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00
                        ,taps_6_7_00);
      xx_loadl_32((void *)(local_198 + -1 + in_RSI));
      filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00
                        ,taps_6_7_00);
      local_198 = local_198 + 4;
    }
    for (local_250 = 4; local_250 < in_stack_00000008; local_250 = local_250 + 4) {
      lVar12 = (local_198 - in_R9D) + in_RSI * 4;
      xx_loadl_32((void *)(lVar12 - in_RSI));
      xx_loadl_32((void *)((long)in_RCX + (long)local_250 + -1));
      uVar1 = extraout_XMM0_Qa_05 & 0xffffff00ffffffff |
              (ulong)*(byte *)((long)local_250 + 3 + (long)in_RCX) << 0x20;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar1;
      local_238 = auVar11 << 0x40;
      auVar5._8_8_ = extraout_XMM0_Qb_02 | uVar1;
      auVar5._0_8_ = extraout_XMM0_Qa_04;
      auVar4._8_8_ = 0xf0a090302010008;
      auVar4._0_8_ = 0xf0a090302010008;
      pshufb(auVar5,auVar4);
      filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00
                        ,taps_6_7_00);
      xx_loadl_32((void *)(lVar12 + in_RSI));
      local_238._0_8_ = local_238._2_8_;
      local_238._8_8_ = uVar1 >> 0x10;
      auVar3._8_8_ = extraout_XMM0_Qb_03 | local_238._8_8_;
      auVar3._0_8_ = extraout_XMM0_Qa_06 | local_238._0_8_;
      auVar2._8_8_ = 0xf0a090302010008;
      auVar2._0_8_ = 0xf0a090302010008;
      pshufb(auVar3,auVar2);
      filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,taps_4_5_00
                        ,taps_6_7_00);
      for (local_254 = 4; local_198 = lVar12 + 4, local_254 < in_R9D; local_254 = local_254 + 4) {
        xx_loadl_32((void *)(~in_RSI + local_198));
        filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,
                          taps_4_5_00,taps_6_7_00);
        xx_loadl_32((void *)(lVar12 + 3 + in_RSI));
        filter_4x2_sse4_1(dst_00,stride_00,pixels_00,taps_0_1_00,in_stack_fffffffffffffe18,
                          taps_4_5_00,taps_6_7_00);
        lVar12 = local_198;
      }
    }
  }
  return;
}

Assistant:

static inline void filter_intra_predictor_sse4_1(void *const dest,
                                                 ptrdiff_t stride,
                                                 const void *const top_row,
                                                 const void *const left_column,
                                                 int mode, const int width,
                                                 const int height) {
  const uint8_t *const top_ptr = (const uint8_t *)top_row;
  const uint8_t *const left_ptr = (const uint8_t *)left_column;
  uint8_t *dst = (uint8_t *)dest;
  if (width == 4) {
    filter_4xh(dst, stride, top_ptr, left_ptr, mode, height);
    return;
  }

  // There is one set of 7 taps for each of the 4x2 output pixels.
  const __m128i taps_0_1 = xx_load_128(av1_filter_intra_taps[mode][0]);
  const __m128i taps_2_3 = xx_load_128(av1_filter_intra_taps[mode][2]);
  const __m128i taps_4_5 = xx_load_128(av1_filter_intra_taps[mode][4]);
  const __m128i taps_6_7 = xx_load_128(av1_filter_intra_taps[mode][6]);

  // This mask rearranges bytes in the order: 0, 1, 2, 3, 4, 8, 9, 15. The 15 at
  // the end is an unused value, which shall be multiplied by 0 when we apply
  // the filter.
  const int64_t kCondenseLeftMask = 0x0F09080403020100;

  // Takes the "left section" and puts it right after p0-p4.
  const __m128i pixel_order1 = _mm_set1_epi64x(kCondenseLeftMask);

  // This mask rearranges bytes in the order: 8, 0, 1, 2, 3, 9, 10, 15. The last
  // byte is unused as above.
  const int64_t kInsertTopLeftMask = 0x0F0A090302010008;

  // Shuffles the "top left" from the left section, to the front. Used when
  // grabbing data from left_column and not top_row.
  const __m128i pixel_order2 = _mm_set1_epi64x(kInsertTopLeftMask);

  // This first pass takes care of the cases where the top left pixel comes from
  // top_row.
  __m128i pixels = xx_loadl_64(top_ptr - 1);
  __m128i left = _mm_slli_si128(xx_loadl_32(left_column), 8);
  pixels = _mm_or_si128(pixels, left);

  // Two sets of the same pixels to multiply with two sets of taps.
  pixels = _mm_shuffle_epi8(pixels, pixel_order1);
  filter_4x2_sse4_1(dst, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                    &taps_6_7);
  left = _mm_srli_si128(left, 1);

  // Load
  pixels = xx_loadl_32(dst + stride);

  // Because of the above shift, this OR 'invades' the final of the first 8
  // bytes of |pixels|. This is acceptable because the 8th filter tap is always
  // a padded 0.
  pixels = _mm_or_si128(pixels, left);
  pixels = _mm_shuffle_epi8(pixels, pixel_order2);
  const ptrdiff_t stride2 = stride << 1;
  const ptrdiff_t stride4 = stride << 2;
  filter_4x2_sse4_1(dst + stride2, stride, &pixels, &taps_0_1, &taps_2_3,
                    &taps_4_5, &taps_6_7);
  dst += 4;
  for (int x = 3; x < width - 4; x += 4) {
    pixels = xx_loadl_32(top_ptr + x);
    pixels = _mm_insert_epi8(pixels, (int8_t)top_ptr[x + 4], 4);
    pixels = _mm_insert_epi8(pixels, (int8_t)dst[-1], 5);
    pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride - 1], 6);

    // Duplicate bottom half into upper half.
    pixels = _mm_shuffle_epi32(pixels, DUPLICATE_FIRST_HALF);
    filter_4x2_sse4_1(dst, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);
    pixels = xx_loadl_32(dst + stride - 1);
    pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride + 3], 4);
    pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride2 - 1], 5);
    pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride + stride2 - 1], 6);

    // Duplicate bottom half into upper half.
    pixels = _mm_shuffle_epi32(pixels, DUPLICATE_FIRST_HALF);
    filter_4x2_sse4_1(dst + stride2, stride, &pixels, &taps_0_1, &taps_2_3,
                      &taps_4_5, &taps_6_7);
    dst += 4;
  }

  // Now we handle heights that reference previous blocks rather than top_row.
  for (int y = 4; y < height; y += 4) {
    // Leftmost 4x4 block for this height.
    dst -= width;
    dst += stride4;

    // Top Left is not available by offset in these leftmost blocks.
    pixels = xx_loadl_32(dst - stride);
    left = _mm_slli_si128(xx_loadl_32(left_ptr + y - 1), 8);
    left = _mm_insert_epi8(left, (int8_t)left_ptr[y + 3], 12);
    pixels = _mm_or_si128(pixels, left);
    pixels = _mm_shuffle_epi8(pixels, pixel_order2);
    filter_4x2_sse4_1(dst, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);

    // The bytes shifted into positions 6 and 7 will be ignored by the shuffle.
    left = _mm_srli_si128(left, 2);
    pixels = xx_loadl_32(dst + stride);
    pixels = _mm_or_si128(pixels, left);
    pixels = _mm_shuffle_epi8(pixels, pixel_order2);
    filter_4x2_sse4_1(dst + stride2, stride, &pixels, &taps_0_1, &taps_2_3,
                      &taps_4_5, &taps_6_7);

    dst += 4;

    // Remaining 4x4 blocks for this height.
    for (int x = 4; x < width; x += 4) {
      pixels = xx_loadl_32(dst - stride - 1);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[-stride + 3], 4);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[-1], 5);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride - 1], 6);

      // Duplicate bottom half into upper half.
      pixels = _mm_shuffle_epi32(pixels, DUPLICATE_FIRST_HALF);
      filter_4x2_sse4_1(dst, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                        &taps_6_7);
      pixels = xx_loadl_32(dst + stride - 1);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride + 3], 4);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride2 - 1], 5);
      pixels = _mm_insert_epi8(pixels, (int8_t)dst[stride2 + stride - 1], 6);

      // Duplicate bottom half into upper half.
      pixels = _mm_shuffle_epi32(pixels, DUPLICATE_FIRST_HALF);
      filter_4x2_sse4_1(dst + stride2, stride, &pixels, &taps_0_1, &taps_2_3,
                        &taps_4_5, &taps_6_7);
      dst += 4;
    }
  }
}